

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_relax_snode.c
# Opt level: O0

void ilu_relax_snode(int n,int *et,int relax_columns,int *descendants,int *relax_end,
                    int *relax_fsupc)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int local_44;
  int snode_start;
  int parent;
  int f;
  int j;
  int *relax_fsupc_local;
  int *relax_end_local;
  int *descendants_local;
  int relax_columns_local;
  int *et_local;
  int n_local;
  
  ifill(relax_end,n,-1);
  ifill(relax_fsupc,n,-1);
  for (parent = 0; parent < n; parent = parent + 1) {
    descendants[parent] = 0;
  }
  for (parent = 0; parent < n; parent = parent + 1) {
    iVar1 = et[parent];
    if (iVar1 != n) {
      descendants[iVar1] = descendants[parent] + 1 + descendants[iVar1];
    }
  }
  snode_start = 0;
  parent = 0;
  while (iVar1 = parent, parent < n) {
    local_44 = et[parent];
    while( true ) {
      bVar2 = false;
      if (local_44 != n) {
        bVar2 = descendants[local_44] < relax_columns;
      }
      if (!bVar2) break;
      parent = local_44;
      local_44 = et[local_44];
    }
    relax_end[iVar1] = parent;
    iVar3 = snode_start + 1;
    relax_fsupc[snode_start] = iVar1;
    do {
      parent = parent + 1;
      snode_start = iVar3;
    } while (descendants[parent] != 0 && parent < n);
  }
  return;
}

Assistant:

void
ilu_relax_snode (
	      const	int n,
	      const int	*et,	       /* column elimination tree */
	      const int relax_columns, /* max no of columns allowed in a
					  relaxed snode */
	      int	*descendants,  /* no of descendants of each node
					 in the etree */
	      int	*relax_end,    /* last column in a supernode
					* if j-th column starts a relaxed
					* supernode, relax_end[j] represents
					* the last column of this supernode */
	      int	*relax_fsupc   /* first column in a supernode
					* relax_fsupc[j] represents the first
					* column of j-th supernode */
	     )
{

    register int j, f, parent;
    register int snode_start;	/* beginning of a snode */

    ifill (relax_end, n, SLU_EMPTY);
    ifill (relax_fsupc, n, SLU_EMPTY);
    for (j = 0; j < n; j++) descendants[j] = 0;

    /* Compute the number of descendants of each node in the etree */
    for (j = 0; j < n; j++) {
	parent = et[j];
	if ( parent != n )  /* not the dummy root */
	    descendants[parent] += descendants[j] + 1;
    }

    /* Identify the relaxed supernodes by postorder traversal of the etree. */
    for (j = f = 0; j < n; ) {
	parent = et[j];
	snode_start = j;
	while ( parent != n && descendants[parent] < relax_columns ) {
	    j = parent;
	    parent = et[j];
	}
	/* Found a supernode with j being the last column. */
	relax_end[snode_start] = j;		/* Last column is recorded */
	j++;
	relax_fsupc[f++] = snode_start;
	/* Search for a new leaf */
	while ( descendants[j] != 0 && j < n ) j++;
    }
}